

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTests.cpp
# Opt level: O3

void vkt::Draw::anon_unknown_1::createChildren(TestCaseGroup *group)

{
  TestContext *testCtx;
  TestNode *pTVar1;
  
  testCtx = (group->super_TestNode).m_testCtx;
  pTVar1 = (TestNode *)operator_new(0x70);
  SimpleDrawTests::SimpleDrawTests((SimpleDrawTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  DrawIndexedTests::DrawIndexedTests((DrawIndexedTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  IndirectDrawTests::IndirectDrawTests((IndirectDrawTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = &createBasicDrawTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  InstancedTests::InstancedTests((InstancedTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  ShaderDrawParametersTests::ShaderDrawParametersTests((ShaderDrawParametersTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  pTVar1 = &createNegativeViewportHeightTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar1);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* group)
{
	tcu::TestContext&	testCtx		= group->getTestContext();

	group->addChild(new SimpleDrawTests					(testCtx));
	group->addChild(new DrawIndexedTests				(testCtx));
	group->addChild(new IndirectDrawTests				(testCtx));
	group->addChild(createBasicDrawTests				(testCtx));
	group->addChild(new InstancedTests					(testCtx));
	group->addChild(new ShaderDrawParametersTests		(testCtx));
	group->addChild(createNegativeViewportHeightTests	(testCtx));
}